

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::VarSlice::VarSlice(VarSlice *this,Var *parent,uint32_t high,uint32_t low)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  pointer puVar1;
  undefined1 uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VarException *this_00;
  long *plVar7;
  undefined4 extraout_var_02;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar11;
  undefined4 uVar12;
  bool bVar13;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_a0;
  pointer local_98;
  pointer ppIStack_90;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  string local_60;
  allocator_type local_39;
  undefined4 local_38;
  uint32_t local_34;
  
  local_34 = low;
  iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0xd])(parent);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  aVar11.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar3),&local_60,parent->var_width_,1
           ,false,Slice);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  uVar6 = local_34;
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b0e20;
  this->parent_var = parent;
  this->low = local_34;
  this->high = high;
  bVar13 = false;
  this->var_high_ = 0;
  this->var_low_ = 0;
  (this->op_).first = high;
  (this->op_).second = local_34;
  this->struct_ = (PackedStruct *)0x0;
  uVar4 = num_size_decrease(parent);
  if (uVar6 == 0 && high == 0) {
    if (parent->type_ == Slice) {
      uVar5 = num_size_decrease((Var *)parent[1].super_IRNode._vptr_IRNode);
      bVar13 = uVar4 == uVar5;
    }
    else {
      bVar13 = false;
    }
  }
  if (uVar6 == 0 && high == 0) {
    iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent);
    if (((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0xa8) -
                *(long *)(CONCAT44(extraout_var_00,iVar3) + 0xa0)) < 5) ||
       (iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent),
       bVar13 || *(int *)(*(long *)(CONCAT44(extraout_var_01,iVar3) + 0xa8) + -4) != 1))
    goto LAB_0018b658;
    iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent);
    uVar12 = CONCAT31((int3)(uVar4 >> 8),
                      (*(long *)(CONCAT44(extraout_var_02,iVar3) + 0xa8) -
                       *(long *)(CONCAT44(extraout_var_02,iVar3) + 0xa0) >> 2) - 1U == (ulong)uVar4)
    ;
  }
  else {
LAB_0018b658:
    uVar12 = 0;
  }
  __first._M_current =
       (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)__last._M_current - (long)__first._M_current == 4) {
    if ((*__first._M_current == 1) && (parent->explicit_array_ == true)) {
      if (local_34 != 0 || high != 0) {
        this_00 = (VarException *)__cxa_allocate_exception(0x10);
        (*(parent->super_IRNode)._vptr_IRNode[0x1f])(&local_98,parent);
        local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = local_98;
        local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppIStack_90;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x50;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = aVar11.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_78;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_60,
                   (detail *)
                   "Parent {0} is a scalar but used marked as an explicit array, only [0, 0] allowed"
                   ,format_str,args);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_a0;
        local_a0 = parent;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_78,__l,&local_39);
        VarException::VarException(this_00,&local_60,&local_78);
        __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (*__first._M_current == 1 && (char)uVar12 == '\0') {
        (this->super_Var).var_width_ = (high - local_34) + 1;
        iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
        uVar2 = (undefined1)iVar3;
        goto LAB_0018b819;
      }
      if ((char)uVar12 != '\x01' || *__first._M_current != 1) goto LAB_0018b772;
      (this->super_Var).var_width_ = parent->var_width_;
      (this->super_Var).is_packed_ = true;
    }
  }
  else {
LAB_0018b772:
    iVar3 = high - local_34;
    local_38 = uVar12;
    if (iVar3 == 0) {
      if ((long)__last._M_current - (long)__first._M_current == 4) {
        local_60._M_dataplus._M_p._0_4_ = 1;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&(this->super_Var).size_,
                   &local_60);
        (this->super_Var).is_packed_ = true;
        uVar12 = local_38;
      }
      else {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_60,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )(__first._M_current + 1),__last,(allocator_type *)&local_98);
        uVar12 = local_38;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  (&(this->super_Var).size_,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_60._M_dataplus._M_p,
                          local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
        }
        iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
        (this->super_Var).is_packed_ = SUB41(iVar3,0);
      }
      (this->super_Var).var_width_ = parent->var_width_;
    }
    else {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_60,__first,__last,
                 (allocator_type *)&local_98);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                (&(this->super_Var).size_,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_60._M_dataplus._M_p,
                        local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
      }
      (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] = iVar3 + 1;
      (this->super_Var).var_width_ = parent->var_width_;
      iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
      uVar2 = (undefined1)iVar3;
      uVar12 = local_38;
LAB_0018b819:
      (this->super_Var).is_packed_ = (bool)uVar2;
    }
  }
  if (parent->type_ == Slice) {
    plVar7 = (long *)__dynamic_cast(parent,&Var::typeinfo,&typeinfo,0);
    puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar8 = (long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar8 == 4) {
      if (*puVar1 == 1 && (char)uVar12 == '\0') {
        iVar3 = (**(code **)(*plVar7 + 0x130))(plVar7);
        this->var_low_ = iVar3 + local_34;
        iVar3 = (**(code **)(*plVar7 + 0x130))(plVar7);
        high = high + iVar3;
        goto LAB_0018ba2c;
      }
      if ((char)uVar12 == '\x01' && *puVar1 == 1) {
        uVar6 = (**(code **)(*plVar7 + 0x130))(plVar7);
        this->var_low_ = uVar6;
        high = (**(code **)(*plVar7 + 0x128))(plVar7);
        goto LAB_0018ba2c;
      }
    }
    uVar9 = lVar8 >> 2;
    uVar6 = parent->var_width_;
    if (1 < uVar9) {
      uVar10 = 1;
      do {
        uVar6 = uVar6 * puVar1[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    iVar3 = (**(code **)(*plVar7 + 0x130))(plVar7);
    this->var_low_ = iVar3 + local_34 * uVar6;
    iVar3 = (**(code **)(*plVar7 + 0x130))(plVar7);
    high = (uVar6 * (high + 1) + iVar3) - 1;
    goto LAB_0018ba2c;
  }
  puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar8 == 4) {
    if ((*puVar1 != 1) || (parent->explicit_array_ != true)) {
      if (*puVar1 == 1) {
        this->var_low_ = local_34;
        goto LAB_0018ba2c;
      }
      goto LAB_0018b9cb;
    }
    this->var_low_ = 0;
    uVar6 = (this->super_Var).var_width_;
  }
  else {
LAB_0018b9cb:
    uVar9 = lVar8 >> 2;
    uVar6 = parent->var_width_;
    if (1 < uVar9) {
      uVar10 = 1;
      do {
        uVar6 = uVar6 * puVar1[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    this->var_low_ = local_34 * uVar6;
    uVar6 = (high + 1) * uVar6;
  }
  high = uVar6 - 1;
LAB_0018ba2c:
  this->var_high_ = high;
  return;
}

Assistant:

VarSlice::VarSlice(Var *parent, uint32_t high, uint32_t low)
    // variable slice is always unsigned based on the spec
    : Var(parent->generator(), "", parent->var_width(), 1, false, VarType::Slice),
      parent_var(parent),
      low(low),
      high(high),
      op_({high, low}) {
    // compute the width
    // notice that if the user has explicit set it to be an array
    // we need to honer their wish
    // we also need to honer the way the dimension the array is set
    auto diff = num_size_decrease(parent);
    auto diff_parent = true;
    if (low == 0 && high == 0 && parent->type() == VarType::Slice) {
        auto p_d = num_size_decrease(reinterpret_cast<VarSlice *>(parent)->parent_var);
        diff_parent = diff != p_d;
    }
    bool dropped_dim_size1 = low == 0 && high == 0 &&
                             parent->get_var_root_parent()->size().size() > 1 &&
                             parent->get_var_root_parent()->size().back() == 1 && diff_parent &&
                             diff == parent->get_var_root_parent()->size().size() - 1;
    if (parent->size().size() == 1 && parent->size().front() == 1 && parent->explicit_array()) {
        if (high != 0 || low != 0) {
            throw VarException(::format("Parent {0} is a scalar but used marked as an explicit "
                                        "array, only [0, 0] allowed",
                                        parent->to_string()),
                               {parent});
        }
    } else if (parent->size().size() == 1 && parent->size().front() == 1 && !dropped_dim_size1) {
        // even it is true, we still need to make sure cases such as
        // [3:0][0:0] declaration (from size = (4, 1)), can be sliced twice before hitting
        // the wire, which means we need to count the number of size decreases
        // this is the actual slice
        var_width_ = high - low + 1;
        is_packed_ = parent->is_packed();
    } else if (parent->size().size() == 1 && parent->size().front() == 1 && dropped_dim_size1) {
        // need to keep the var width calculation correct
        var_width_ = parent->var_width();
        is_packed_ = true;
    } else {
        if (high == low) {
            if (parent->size().size() == 1) {
                size_ = {1};
                is_packed_ = true;
            } else {
                size_ = std::vector<uint32_t>(parent->size().begin() + 1, parent->size().end());
                is_packed_ = parent->is_packed();
            }
            var_width_ = parent->var_width();
        } else {
            // readjust the top slice
            size_ = std::vector<uint32_t>(parent->size().begin(), parent->size().end());
            size_.back() = high - low + 1;
            var_width_ = parent->var_width();
            is_packed_ = parent->is_packed();
        }
    }
    // compute the var high and var_low
    if (parent->type() != VarType::Slice) {
        // use width to compute
        // honer user's wish
        if (parent->size().size() == 1 && parent->size().front() == 1 && parent->explicit_array()) {
            var_low_ = 0;
            var_high_ = var_width_ - 1;
        } else if (parent->size().size() == 1 && parent->size().front() == 1) {
            var_low_ = low;
            var_high_ = high;
        } else {
            uint32_t base_width = parent->var_width();
            for (uint64_t i = 1; i < parent->size().size(); i++) base_width *= parent->size()[i];
            var_low_ = low * base_width;
            var_high_ = (high + 1) * base_width - 1;
        }
    } else {
        // it's a slice
        auto *slice = dynamic_cast<VarSlice *>(parent);
        if (parent->size().size() == 1 && parent->size().front() == 1 && !dropped_dim_size1) {
            var_low_ = low + slice->var_low();
            var_high_ = (high + 1) + slice->var_low() - 1;
        } else if (parent->size().size() == 1 && parent->size().front() == 1 && dropped_dim_size1) {
            var_low_ = slice->var_low();
            var_high_ = slice->var_high();
        } else {
            uint32_t base_width = parent->var_width();
            for (uint64_t i = 1; i < parent->size().size(); i++) base_width *= parent->size()[i];
            var_low_ = slice->var_low() + low * base_width;
            var_high_ = slice->var_low() + (high + 1) * base_width - 1;
        }
    }
}